

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Model>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Model *model,
               string *warn,string *err,PrimReconstructOptions *options)

{
  size_type *psVar1;
  _Rb_tree_header *p_Var2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  _Rb_tree_node_base *__k;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  Model *local_218;
  string *local_210;
  string *local_208;
  _Rb_tree_node_base *local_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  p_Var2 = &local_1d8._M_impl.super__Rb_tree_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var7 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  local_218 = model;
  local_210 = warn;
  local_208 = err;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var8) {
    local_218 = (Model *)&model->props;
    do {
      __k = p_Var7 + 1;
      cVar3 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_1d8,(key_type *)__k);
      if ((_Rb_tree_header *)cVar3._M_node == p_Var2) {
        pmVar4 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                               *)local_218,(key_type *)__k);
        local_200 = __k;
        ::std::__cxx11::string::_M_assign((string *)pmVar4);
        (pmVar4->_attrib)._varying_authored = (bool)p_Var7[3].field_0x4;
        (pmVar4->_attrib)._variability = p_Var7[3]._M_color;
        ::std::__cxx11::string::_M_assign((string *)&(pmVar4->_attrib)._type_name);
        linb::any::operator=((any *)&(pmVar4->_attrib)._var,(any *)&p_Var7[4]._M_parent);
        (pmVar4->_attrib)._var._blocked = SUB41(p_Var7[5]._M_color,0);
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&(pmVar4->_attrib)._var._ts,
                    (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&p_Var7[5]._M_parent);
        (pmVar4->_attrib)._var._ts._dirty = SUB41(p_Var7[6]._M_color,0);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&(pmVar4->_attrib)._paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var7[6]._M_parent);
        AttrMetas::operator=(&(pmVar4->_attrib)._metas,(AttrMetas *)(p_Var7 + 7));
        *(_Base_ptr *)&pmVar4->_listOpQual = p_Var7[0x17]._M_parent;
        (pmVar4->_rel).type = *(Type *)&p_Var7[0x17]._M_left;
        Path::operator=(&(pmVar4->_rel).targetPath,(Path *)&p_Var7[0x17]._M_right);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&(pmVar4->_rel).targetPathVector,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &p_Var7[0x1e]._M_parent);
        (pmVar4->_rel).listOpQual = p_Var7[0x1f]._M_color;
        AttrMetas::operator=(&(pmVar4->_rel)._metas,(AttrMetas *)&p_Var7[0x1f]._M_parent);
        (pmVar4->_rel)._varying_authored = *(bool *)&p_Var7[0x2f]._M_left;
        ::std::__cxx11::string::_M_assign((string *)&pmVar4->_prop_value_type_name);
        __k = local_200;
        pmVar4->_has_custom = *(bool *)&p_Var7[0x30]._M_right;
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
      }
      cVar3 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_1d8,(key_type *)__k);
      if ((_Rb_tree_header *)cVar3._M_node == p_Var2) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReconstructPrim",0xf);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0xafb);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        ::std::operator+(&local_238,"Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_238._M_dataplus._M_p,
                            local_238._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if (local_210 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          plVar6 = (long *)::std::__cxx11::string::_M_append
                                     ((char *)local_1f8,(ulong)(local_208->_M_dataplus)._M_p);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          psVar1 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_238.field_2._M_allocated_capacity = *psVar1;
            local_238.field_2._8_8_ = plVar6[3];
          }
          else {
            local_238.field_2._M_allocated_capacity = *psVar1;
            local_238._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_238._M_string_length = plVar6[1];
          *plVar6 = (long)psVar1;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)local_210,(string *)&local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if (local_1f8[0] != local_1e8) {
            operator_delete(local_1f8[0],local_1e8[0] + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        ::std::ios_base::~ios_base(local_138);
      }
      p_Var7 = (_Base_ptr)::std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_1d8,(_Link_type)local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent);
  return true;
}

Assistant:

bool ReconstructPrim<Model>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Model *model,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  DCOUT("Model ");
  (void)spec;
  (void)references;
  (void)model;
  (void)err;
  (void)options;

  std::set<std::string> table;
  for (const auto &prop : properties) {
    ADD_PROPERTY(table, prop, Model, model->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}